

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

bool cfd::core::Transaction::CheckTxOutBuffer
               (uint8_t *buffer,size_t buf_size,uint64_t txout_num,size_t txout_num_size,
               void *tx_pointer,
               vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *txout_list)

{
  int64_t *piVar1;
  ulong uVar2;
  bool bVar3;
  CfdException *this;
  byte bVar4;
  size_t *p_size;
  undefined7 uVar5;
  ulong data_size;
  long lVar6;
  long lVar7;
  uint8_t *__src;
  long lVar8;
  bool bVar9;
  Amount AVar10;
  uint64_t script_size;
  size_t vnum_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  TxOut out;
  int ret;
  uint64_t local_138;
  _func_int **local_130;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *local_128;
  void *local_120;
  undefined8 local_118;
  uint8_t *local_110;
  int64_t local_108;
  size_t local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  Amount local_e0;
  undefined1 local_d0 [16];
  _func_int *local_c0;
  Script local_b8;
  ByteData local_80;
  Script local_68;
  
  lVar8 = buf_size - txout_num_size;
  if (buf_size < txout_num_size || lVar8 == 0) {
    bVar3 = false;
  }
  else {
    if (txout_num == 0) {
      bVar4 = 1;
      lVar6 = 0;
    }
    else {
      local_110 = buffer + txout_num_size;
      lVar7 = txout_num - 1;
      local_130 = (_func_int **)&PTR__AbstractTxOut_0025aba8;
      lVar6 = 0;
      local_118 = 0;
      local_128 = txout_list;
      local_120 = tx_pointer;
      do {
        bVar3 = true;
        if ((ulong)(lVar8 - lVar6) < 9) {
          local_118 = CONCAT71((int7)((ulong)local_118 >> 8),1);
        }
        else {
          piVar1 = (int64_t *)(local_110 + lVar6);
          local_108 = *piVar1;
          data_size = (lVar8 - lVar6) - 8;
          local_138 = 0;
          local_100 = 0;
          p_size = &local_100;
          bVar3 = AbstractTransaction::GetVariableInt
                            ((uint8_t *)(piVar1 + 1),data_size,&local_138,p_size);
          if (bVar3) {
            uVar2 = local_138 + local_100;
            if (uVar2 <= data_size) {
              __src = (uint8_t *)((long)(piVar1 + 1) + local_100);
              if (local_120 != (void *)0x0) {
                local_68._vptr_Script._0_4_ =
                     wally_tx_add_raw_output(local_120,local_108,__src,local_138,0);
                if ((int)local_68._vptr_Script != 0) {
                  local_d0._0_8_ = "cfdcore_transaction.cpp";
                  local_d0._8_4_ = 0x10f;
                  local_c0 = (_func_int *)0x21cbef;
                  logger::log<int&>((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,
                                    "wally_tx_add_raw_output NG[{}].",(int *)&local_68);
                  this = (CfdException *)__cxa_allocate_exception(0x30);
                  local_d0._0_8_ = &local_c0;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_d0,"vout add error.","");
                  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_d0);
                  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
                }
                local_68._vptr_Script._0_4_ = 0;
              }
              lVar6 = lVar6 + uVar2 + 8;
              if (local_128 == (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)0x0) {
                bVar3 = false;
              }
              else {
                ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
                           local_138,(allocator_type *)local_d0);
                memcpy(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,__src,
                       (long)local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
                AVar10 = Amount::CreateBySatoshiAmount(local_108);
                local_e0.amount_ = AVar10.amount_;
                local_e0.ignore_check_ = AVar10.ignore_check_;
                ByteData::ByteData(&local_80,&local_f8);
                Script::Script(&local_68,&local_80);
                TxOut::TxOut((TxOut *)local_d0,&local_e0,&local_68);
                Script::~Script(&local_68);
                if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_80.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::push_back
                          (local_128,(value_type *)local_d0);
                local_d0._0_8_ = local_130;
                Script::~Script(&local_b8);
                if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                bVar3 = false;
              }
              goto LAB_001a01b9;
            }
            uVar5 = (undefined7)(local_138 >> 8);
          }
          else {
            uVar5 = (undefined7)((ulong)p_size >> 8);
          }
          bVar3 = true;
          local_118 = CONCAT71(uVar5,1);
        }
LAB_001a01b9:
        bVar9 = lVar7 != 0;
        lVar7 = lVar7 + -1;
      } while ((!bVar3) && (bVar9));
      bVar4 = (byte)local_118 ^ 1;
    }
    bVar3 = (bool)(lVar8 == lVar6 & bVar4);
  }
  return bVar3;
}

Assistant:

bool Transaction::CheckTxOutBuffer(
    const uint8_t *buffer, size_t buf_size, uint64_t txout_num,
    size_t txout_num_size, void *tx_pointer, std::vector<TxOut> *txout_list) {
  bool is_success = false;
  if (buf_size > txout_num_size) {
    size_t data_size = buf_size - txout_num_size;
    size_t offset = 0;
    const uint8_t *address_pointer = buffer;
    address_pointer += txout_num_size;
    bool is_error = false;
    for (uint64_t index = 0; index < txout_num; ++index) {
      const uint8_t *work_address = &address_pointer[offset];
      size_t limit = data_size - offset;
      size_t total = 0;
      // check for value
      if (limit <= sizeof(int64_t)) {
        is_error = true;
        break;
      }
      uint64_t amount;
      memcpy(&amount, work_address, sizeof(amount));
      work_address += sizeof(uint64_t);
      limit -= sizeof(uint64_t);
      total += sizeof(uint64_t);
      // Check locking script
      uint64_t script_size = 0;
      size_t vnum_size = 0;
      if (!GetVariableInt(work_address, limit, &script_size, &vnum_size)) {
        is_error = true;
        break;
      } else if (limit < (vnum_size + script_size)) {
        is_error = true;
        break;
      }
      work_address += vnum_size;
      total += vnum_size + script_size;
      offset += total;

      // Copy of TxOut
      if (tx_pointer != NULL) {
        int ret = wally_tx_add_raw_output(
            static_cast<struct wally_tx *>(tx_pointer), amount, work_address,
            script_size, 0);
        if (ret != WALLY_OK) {
          warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}].", ret);
          throw CfdException(kCfdIllegalStateError, "vout add error.");
        }
      }
      if (txout_list != nullptr) {
        std::vector<uint8_t> byte_array(script_size);
        memcpy(byte_array.data(), work_address, byte_array.size());
        TxOut out(
            Amount::CreateBySatoshiAmount(amount),
            Script(ByteData(byte_array)));
        txout_list->push_back(out);
      }
    }

    if ((!is_error) && (data_size == offset)) {
      is_success = true;
    }
  }
  return is_success;
}